

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImGuiTextBuffer::clear(ImGuiTextBuffer *this)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  char *__dest;
  int iVar5;
  int iVar6;
  
  pcVar3 = (this->Buf).Data;
  if (pcVar3 != (char *)0x0) {
    (this->Buf).Size = 0;
    pIVar4 = GImGui;
    (this->Buf).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar4->IO).MemFreeFn)(pcVar3);
    (this->Buf).Data = (char *)0x0;
  }
  pIVar4 = GImGui;
  iVar6 = (this->Buf).Size;
  iVar2 = (this->Buf).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (char *)(*(pIVar4->IO).MemAllocFn)((long)iVar6);
      pcVar3 = (this->Buf).Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(__dest,pcVar3,(long)(this->Buf).Size);
      }
      pcVar3 = (this->Buf).Data;
      if (pcVar3 != (char *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pcVar3);
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar6;
    }
  }
  iVar6 = (this->Buf).Size;
  (this->Buf).Size = iVar6 + 1;
  (this->Buf).Data[iVar6] = '\0';
  return;
}

Assistant:

void                clear() { Buf.clear(); Buf.push_back(0); }